

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O2

bool __thiscall
charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>::is_near
          (default_traits<unsigned_short,_charls::quad<unsigned_short>_> *this,
          quad<unsigned_short> lhs,quad<unsigned_short> rhs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = (lhs.super_triplet<unsigned_short>._0_4_ & 0xffff) -
          (rhs.super_triplet<unsigned_short>._0_4_ & 0xffff);
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  uVar1 = this->near_lossless;
  if (iVar2 <= (int)uVar1) {
    uVar5 = (lhs.super_triplet<unsigned_short>._2_4_ & 0xffff) -
            (rhs.super_triplet<unsigned_short>._2_4_ & 0xffff);
    uVar4 = -uVar5;
    if (0 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if (uVar4 <= uVar1) {
      uVar5 = (lhs._4_4_ & 0xffff) - (rhs._4_4_ & 0xffff);
      uVar4 = -uVar5;
      if (0 < (int)uVar5) {
        uVar4 = uVar5;
      }
      if (uVar4 <= uVar1) {
        uVar5 = (uint)lhs.field_0.v4 - (uint)rhs.field_0.v4;
        uVar4 = -uVar5;
        if (0 < (int)uVar5) {
          uVar4 = uVar5;
        }
        return uVar4 <= uVar1;
      }
    }
  }
  return false;
}

Assistant:

bool is_near(const quad<SampleType> lhs, const quad<SampleType> rhs) const noexcept
    {
        return std::abs(lhs.v1 - rhs.v1) <= near_lossless && std::abs(lhs.v2 - rhs.v2) <= near_lossless &&
               std::abs(lhs.v3 - rhs.v3) <= near_lossless && std::abs(lhs.v4 - rhs.v4) <= near_lossless;
    }